

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cpp
# Opt level: O1

void ComputerThink(Situation *situation)

{
  bool bVar1;
  uint uVar2;
  ostream *poVar3;
  undefined4 unaff_EBP;
  ulong uVar4;
  int depth;
  Movement MVar5;
  int move_num;
  ofstream f;
  Movement move_list [128];
  char local_855;
  int local_854;
  Situation *local_850;
  undefined8 local_848;
  char *local_840;
  undefined1 local_838 [16];
  char local_828 [232];
  ios_base local_740 [264];
  undefined1 local_638 [1544];
  
  isTimeLimit = false;
  step = 0;
  ResetHashTable();
  ResetHistory();
  StartTime = clock();
  if (situation->UseBook == true) {
    MVar5 = ReadBookTable(situation);
    if ((MVar5.from != '\0') &&
       (bVar1 = MovementsLegal(MVar5,situation), unaff_EBP = MVar5._8_4_, bVar1)) {
      MovementToStr_abi_cxx11_((string *)local_638,MVar5);
      printf("bestmove %s\n",local_638._0_8_);
      if ((Situation *)local_638._0_8_ != (Situation *)(local_638 + 0x10)) {
        operator_delete((void *)local_638._0_8_);
      }
      fflush(_stdout);
      return;
    }
  }
  local_854 = 0;
  InitRootMove(situation,&local_854,(Movement *)local_638);
  if (local_854 == 1) {
    uVar2 = SUB84(local_638._0_8_,1) & 0xffffff;
    uVar4 = local_638._0_8_ & 0xffffffffffff0000;
    situation = (Situation *)local_638._0_8_;
    unaff_EBP = local_638._8_4_;
  }
  else {
    NowMaxDepth = 1;
    uVar2 = SearchRoot(situation,1,(Movement *)local_638,local_854);
    if (isTimeLimit == false) {
      local_840 = _VTT;
      local_848 = _stdin;
      depth = 2;
      local_850 = situation;
      do {
        unaff_EBP = BestMove._8_4_;
        situation = (Situation *)BestMove._0_8_;
        debug_value = uVar2;
        std::ofstream::ofstream((ostream *)local_838);
        std::ofstream::open((char *)local_838,0x10f2b5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_838,"Depth: ",7);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_838,depth + -1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," Time: ",7);
        clock();
        poVar3 = std::ostream::_M_insert<long>((long)poVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"ms \n",4);
        std::ofstream::close();
        local_838._0_8_ = local_840;
        *(undefined8 *)(local_838 + *(long *)(local_840 + -0x18)) = local_848;
        std::filebuf::~filebuf((filebuf *)(local_838 + 8));
        std::ios_base::~ios_base(local_740);
        if ((0x26f8 < (int)uVar2) || (depth == 0x19)) break;
        NowMaxDepth = depth;
        uVar2 = SearchRoot(local_850,depth,(Movement *)local_638,local_854);
        depth = depth + 1;
      } while (isTimeLimit == false);
      uVar2 = SUB84(situation,1) & 0xffffff;
      uVar4 = (ulong)situation & 0xffffffffffff0000;
    }
    else {
      uVar4 = 0;
    }
  }
  if ((char)situation == (char)uVar2) {
    puts("nobestmove");
  }
  else {
    MVar5._0_8_ = uVar4 | (ulong)situation & 0xff | (ulong)((uVar2 & 0xff) << 8);
    MVar5.catc = (UINT8)unaff_EBP;
    MVar5.movec = SUB41(unaff_EBP,1);
    MVar5._10_2_ = SUB42(unaff_EBP,2);
    MovementToStr_abi_cxx11_((string *)local_838,MVar5);
    printf("bestmove %s\n",local_838._0_8_);
    if ((char *)local_838._0_8_ != local_828) {
      operator_delete((void *)local_838._0_8_);
    }
  }
  fflush(_stdout);
  std::ofstream::ofstream(local_838);
  std::ofstream::open(local_838,0x10f2b5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_838,"Bestmove\'s value: ",0x12);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_838,debug_value);
  local_855 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_855,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_838,"=========================================\n",0x2a);
  std::ofstream::close();
  local_838._0_8_ = _VTT;
  *(undefined8 *)(local_838 + *(long *)(_VTT + -0x18)) = _stdin;
  std::filebuf::~filebuf((filebuf *)(local_838 + 8));
  std::ios_base::~ios_base(local_740);
  return;
}

Assistant:

void ComputerThink(Situation& situation){
    int value, max_depth;
    Movement best_move_save;
    isTimeLimit = false;
    step = 0;
    ResetHashTable();   // 清空置换表
    ResetHistory();     // 清空历史表和杀手表
    StartTime = clock();

    // 读取开局库
    if(situation.UseBook){
        Movement book_move = ReadBookTable(situation);
        if(book_move.from != 0 && MovementsLegal(book_move, situation)){
            printf ("bestmove %s\n", MovementToStr(book_move).c_str());
		    fflush (stdout);
            return;
        }
    }

    Movement move_list[128];            // 当前所有着法
    int move_num = 0;
    InitRootMove(situation, move_num, move_list);
    // 唯一着法，不必搜索直接返回
    if(move_num == 1){
        best_move_save = move_list[0];
    }
    else{
        // 迭代加深搜索
        for(max_depth = 1; max_depth <= MAX_DEPTH; max_depth++){
            NowMaxDepth = max_depth;
            value = SearchRoot(situation, max_depth, move_list, move_num);
            if(isTimeLimit){
                break;
            }
            else{
                best_move_save = BestMove;
                debug_value = value;
                // 输出日志文件(每层搜索结果)
                std::ofstream f;
                f.open("debug.log", std::ios::app | std::ios::out);
                f << "Depth: " << max_depth << " Time: " << clock() - StartTime << "ms \n";
                f.close();
            }
            if(value > WIN_VALUE) break;
        }
    }


    // 必败 认输
    if(best_move_save.from == best_move_save.to){
        printf ( "nobestmove\n" ); // 认输
		fflush (stdout);
    }
    // 输出最优着法
    else{
        printf ("bestmove %s\n", MovementToStr(best_move_save).c_str());
		fflush (stdout);
    }

    // 输出日志文件(返回最佳着法)
    std::ofstream f;
    f.open("debug.log", std::ios::app | std::ios::out);
    f << "Bestmove's value: " << debug_value << '\n';
    f << "=========================================\n";
    f.close();
    return;
}